

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O0

void moveLinear(MySimulator *sim,int dx,int dy,bool isDown)

{
  Timer *local_58;
  Timer *local_50;
  float local_44;
  int local_40;
  Timer *tim2;
  Timer *tim1;
  bool d2is0;
  int d2px;
  int d1px;
  bool isDown_local;
  int dy_local;
  int dx_local;
  MySimulator *sim_local;
  
  if ((dx != 0) || (dy != 0)) {
    brown::MySimulator::setDirx(sim,0 < dx);
    brown::MySimulator::setDiry(sim,0 < dy);
    brown::MySimulator::setDown(sim,isDown);
    if (dx < 1) {
      dx = -dx;
    }
    if (dy < 1) {
      dy = -dy;
    }
    isxmain = dy < dx;
    local_40 = dx;
    if (isxmain) {
      local_40 = dy;
      dy = dx;
    }
    r1step = dy * (sim->super_Simulator).PULPERPIX;
    r2step = local_40 * (sim->super_Simulator).PULPERPIX;
    if (local_40 != 0) {
      local_44 = (float)r1step / (float)r2step;
    }
    else {
      local_44 = -1.0;
    }
    tg = local_44;
    if (isxmain) {
      local_50 = brown::MySimulator::getTimx(sim);
    }
    else {
      local_50 = brown::MySimulator::getTimy(sim);
    }
    if ((isxmain & 1U) == 0) {
      local_58 = brown::MySimulator::getTimx(sim);
    }
    else {
      local_58 = brown::MySimulator::getTimy(sim);
    }
    brown::Timer::setPeriod(local_50,0);
    brown::Timer::start(local_50);
    if (local_40 != 0) {
      brown::Timer::setPeriod(local_58,0);
      brown::Timer::start(local_58);
    }
  }
  return;
}

Assistant:

static void moveLinear(brown::MySimulator& sim, int dx, int dy, bool isDown) {
    if (dx == 0 && dy == 0) {
        return;
    }

    sim.setDirx(dx > 0);
    sim.setDiry(dy > 0);
    sim.setDown(isDown);
    dx = std::abs(dx);
    dy = std::abs(dy);

    isxmain = (dx > dy);
    int d1px = (isxmain ? dx : dy);
    int d2px = (isxmain ? dy : dx);
    bool d2is0 = (d2px == 0);

    r1step = d1px * sim.PULPERPIX;
    r2step = d2px * sim.PULPERPIX;
    tg = d2is0? -1 : static_cast<float>(r1step)/r2step;

    // start timers
    auto& tim1 = isxmain ? sim.getTimx() : sim.getTimy();
    auto& tim2 = isxmain ? sim.getTimy() : sim.getTimx();

    tim1.setPeriod(0);
    tim1.start();
    if (!d2is0) {
        tim2.setPeriod(0);
        tim2.start();
    }
}